

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

void ktxVulkanDeviceInfo_Destroy(ktxVulkanDeviceInfo *This)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    ktxVulkanDeviceInfo_Destruct((ktxVulkanDeviceInfo *)0x481986);
    free(in_RDI);
    return;
  }
  __assert_fail("This != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                ,0x187,"void ktxVulkanDeviceInfo_Destroy(ktxVulkanDeviceInfo *)");
}

Assistant:

void
ktxVulkanDeviceInfo_Destroy(ktxVulkanDeviceInfo* This)
{
    assert(This != NULL);
    ktxVulkanDeviceInfo_Destruct(This);
    free(This);
}